

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFoodWeb_kry.c
# Opt level: O0

void FreeUserData(UserData data)

{
  void *in_RDI;
  int jy;
  int jx;
  int local_10;
  int local_c;
  
  for (local_c = 0; local_c < 8; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 8; local_10 = local_10 + 1) {
      SUNDlsMat_destroyMat
                (*(undefined8 *)((long)in_RDI + (long)local_10 * 8 + (long)local_c * 0x40));
      SUNDlsMat_destroyArray
                (*(undefined8 *)((long)in_RDI + (long)local_10 * 8 + (long)local_c * 0x40 + 0x200));
    }
  }
  SUNDlsMat_destroyMat(*(undefined8 *)((long)in_RDI + 0x400));
  free(*(void **)((long)in_RDI + 0x408));
  free(*(void **)((long)in_RDI + 0x418));
  free(*(void **)((long)in_RDI + 0x420));
  N_VDestroy(*(undefined8 *)((long)in_RDI + 0x410));
  free(in_RDI);
  return;
}

Assistant:

static void FreeUserData(UserData data)
{
  int jx, jy;

  for (jx = 0; jx < MX; jx++)
  {
    for (jy = 0; jy < MY; jy++)
    {
      SUNDlsMat_destroyMat((data->P)[jx][jy]);
      SUNDlsMat_destroyArray((data->pivot)[jx][jy]);
    }
  }

  SUNDlsMat_destroyMat(acoef);
  free(bcoef);
  free(cox);
  free(coy);
  N_VDestroy(data->rates);
  free(data);
}